

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  SessionHandle *data_00;
  void *pvVar1;
  long lVar2;
  long CSeq_recv;
  long CSeq_sent;
  CURLcode httpStatus;
  RTSP *rtsp;
  SessionHandle *data;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  data._3_1_ = premature;
  if ((data_00->set).rtspreq == RTSPREQ_RECEIVE) {
    data._3_1_ = 1;
  }
  conn_local._4_4_ = Curl_http_done(conn,status,(_Bool)(data._3_1_ & 1));
  if (pvVar1 != (void *)0x0) {
    lVar2 = *(long *)((long)pvVar1 + 0x90);
    if (((data_00->set).rtspreq == RTSPREQ_RECEIVE) || (*(long *)((long)pvVar1 + 0x88) == lVar2)) {
      if (((data_00->set).rtspreq == RTSPREQ_RECEIVE) && ((conn->proto).rtspc.rtp_channel == -1)) {
        Curl_infof(data_00,"Got an RTP Receive with a CSeq of %ld\n",lVar2);
      }
    }
    else {
      Curl_failf(data_00,"The CSeq of this request %ld did not match the response %ld",
                 *(long *)((long)pvVar1 + 0x88),lVar2);
      conn_local._4_4_ = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode rtsp_done(struct connectdata *conn,
                          CURLcode status, bool premature)
{
  struct SessionHandle *data = conn->data;
  struct RTSP *rtsp = data->req.protop;
  CURLcode httpStatus;
  long CSeq_sent;
  long CSeq_recv;

  /* Bypass HTTP empty-reply checks on receive */
  if(data->set.rtspreq == RTSPREQ_RECEIVE)
    premature = TRUE;

  httpStatus = Curl_http_done(conn, status, premature);

  if(rtsp) {
    /* Check the sequence numbers */
    CSeq_sent = rtsp->CSeq_sent;
    CSeq_recv = rtsp->CSeq_recv;
    if((data->set.rtspreq != RTSPREQ_RECEIVE) && (CSeq_sent != CSeq_recv)) {
      failf(data,
            "The CSeq of this request %ld did not match the response %ld",
            CSeq_sent, CSeq_recv);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    else if(data->set.rtspreq == RTSPREQ_RECEIVE &&
            (conn->proto.rtspc.rtp_channel == -1)) {
      infof(data, "Got an RTP Receive with a CSeq of %ld\n", CSeq_recv);
      /* TODO CPC: Server -> Client logic here */
    }
  }

  return httpStatus;
}